

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<unsigned_long_long,QWidget*>::emplace_helper<QWidget*>
          (QHash<unsigned_long_long,_QWidget_*> *this,unsigned_long_long *key,QWidget **args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<unsigned_long_long,_QWidget_*> *n;
  iterator<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *in_RDX;
  Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_>::
  findOrInsert<unsigned_long_long>(in_RSI,(unsigned_long_long *)in_RDX);
  n = QHashPrivate::iterator<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_>::node(in_RDX);
  QHashPrivate::Node<unsigned_long_long,QWidget*>::createInPlace<QWidget*>
            (n,(unsigned_long_long *)in_RSI,(QWidget **)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<unsigned_long_long,_QWidget_*>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }